

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O0

EnumDecl * __thiscall SQASTReader::readEnumDecl(SQASTReader *this)

{
  int8_t iVar1;
  SQASTReader *this_00;
  EnumDecl *this_01;
  EnumDecl *pEVar2;
  SQChar *id;
  undefined8 in_RDI;
  LiteralExpr *v;
  SQChar *n;
  size_t i;
  size_t size;
  EnumDecl *e;
  bool isGlobal;
  SQChar *name;
  size_type_conflict newSize;
  SQASTReader *in_stack_ffffffffffffffc0;
  EnumDecl *this_02;
  undefined8 in_stack_ffffffffffffffd8;
  undefined1 args_2;
  char *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  
  newSize = (size_type_conflict)((ulong)in_RDI >> 0x20);
  args_2 = (undefined1)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
  this_00 = (SQASTReader *)readString(in_stack_ffffffffffffffc0);
  iVar1 = InputStream::readInt8((InputStream *)in_stack_ffffffffffffffc0);
  this_01 = newNode<SQCompilation::EnumDecl,Arena*,char_const*,bool>
                      (this_00,(Arena *)CONCAT17(iVar1 != '\0',in_stack_ffffffffffffffe8),
                       in_stack_ffffffffffffffe0,(bool)args_2);
  pEVar2 = (EnumDecl *)InputStream::readUInt64((InputStream *)0x143306);
  SQCompilation::EnumDecl::consts(this_01);
  ArenaVector<SQCompilation::EnumConst>::resize
            ((ArenaVector<SQCompilation::EnumConst> *)in_stack_ffffffffffffffc0,newSize);
  for (this_02 = (EnumDecl *)0x0; this_02 < pEVar2;
      this_02 = (EnumDecl *)
                ((long)&(this_02->super_Decl).super_Statement.super_Node.super_ArenaObj.
                        _vptr_ArenaObj + 1)) {
    id = readString(in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc0 = (SQASTReader *)readNonNullLiteral(in_stack_ffffffffffffffc0);
    SQCompilation::EnumDecl::addConst(this_02,id,(LiteralExpr *)in_stack_ffffffffffffffc0);
  }
  return this_01;
}

Assistant:

EnumDecl *SQASTReader::readEnumDecl() {
  const SQChar *name = readString();
  bool isGlobal = stream->readInt8();

  EnumDecl *e = newNode<EnumDecl>(astArena, name, isGlobal);

  size_t size = stream->readUInt64();
  e->consts().resize(size);

  for (size_t i = 0; i < size; ++i) {
    const SQChar *n = readString();
    LiteralExpr *v = readNonNullLiteral();
    e->addConst(n, v);
  }

  return e;
}